

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_eval.h
# Opt level: O2

double mp::ComputeValue<mp::VarInfoRecomp>(NumberofVarConstraint *con,VarInfoRecomp *x)

{
  VarVecRecomp *this;
  int i;
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  this = &(x->super_VarInfoRecompTypedef).x_;
  dVar2 = VarVecRecomp::operator[]
                    (this,*(con->
                           super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumberofVarId>
                           ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start);
  lVar1 = (long)(con->
                super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumberofVarId>
                ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(con->
                super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumberofVarId>
                ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  dVar3 = 0.0;
LAB_001bfb91:
  lVar1 = lVar1 + -1;
  if (lVar1 == 0) {
    return dVar3;
  }
  i = (con->
      super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumberofVarId>
      ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [lVar1];
  if ((x->super_VarInfoRecompTypedef).type_.data_[i] != INTEGER) goto LAB_001bfbca;
  dVar4 = VarVecRecomp::operator[](this,i);
  dVar4 = round(dVar4);
  if ((dVar4 != dVar2) || (NAN(dVar4) || NAN(dVar2))) goto LAB_001bfbca;
  goto LAB_001bfbed;
LAB_001bfbca:
  dVar4 = VarVecRecomp::operator[](this,i);
  if (ABS(dVar4 - dVar2) <= (x->super_VarInfoRecompTypedef).feastol_) {
LAB_001bfbed:
    dVar3 = dVar3 + 1.0;
  }
  goto LAB_001bfb91;
}

Assistant:

double ComputeValue(const NumberofVarConstraint& con, const VarVec& x) {
  double result = 0.0;
  const auto& args = con.GetArguments();
  auto k = x[args[0]];
  for (auto i=args.size(); --i; ) {
    auto v = args[i];
    if ((x.is_var_int(v)
         && std::round(x[v]) == k)
        || std::fabs(x[v] - k) <= x.feastol())
      ++result;
  }
  return result;
}